

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O2

double inform_range(double *series,size_t n,double *min,double *max,inform_error *err)

{
  double dVar1;
  double dVar2;
  size_t i;
  size_t sVar3;
  double dVar4;
  double dVar5;
  
  if (series == (double *)0x0) {
    dVar4 = 0.0;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
      return dVar4;
    }
  }
  else if (n == 0) {
    dVar4 = 0.0;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
      return dVar4;
    }
  }
  else {
    dVar4 = *series;
    dVar5 = dVar4;
    for (sVar3 = 1; n != sVar3; sVar3 = sVar3 + 1) {
      dVar1 = series[sVar3];
      dVar2 = dVar1;
      if (dVar5 <= dVar1) {
        dVar2 = dVar5;
      }
      dVar5 = dVar2;
      if (dVar1 <= dVar4) {
        dVar1 = dVar4;
      }
      dVar4 = dVar1;
    }
    if (min != (double *)0x0) {
      *min = dVar5;
    }
    if (max != (double *)0x0) {
      *max = dVar4;
    }
    dVar4 = dVar4 - dVar5;
  }
  return dVar4;
}

Assistant:

double inform_range(double const *series, size_t n, double *min, double *max,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);

    double a = series[0], b = series[0];
    for (size_t i = 1; i < n; ++i)
    {
        if (series[i] < a) a = series[i];
        if (b < series[i]) b = series[i];
    }
    if (min != NULL) *min = a;
    if (max != NULL) *max = b;
    return (b - a);
}